

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::NumLayersParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,NumLayersParams *this,NumLayersParams *params)

{
  char *__s;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator<char> local_1b1;
  undefined1 local_1b0 [8];
  string kindStr;
  ostringstream os;
  NumLayersParams *params_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(kindStr.field_2._M_local_buf + 8));
  __s = "2D Array Texture";
  if (this->textureKind == 0x806f) {
    __s = "3D Texture";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,__s,&local_1b1);
  std::allocator<char>::~allocator(&local_1b1);
  std::operator+(&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,", "
                );
  poVar1 = std::operator<<((ostream *)((long)&kindStr.field_2 + 8),(string *)&local_1e8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->numLayers);
  poVar1 = std::operator<<(poVar1," layers, ");
  poVar1 = std::operator<<(poVar1,"attached layer ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->attachmentLayer);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(kindStr.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string NumLayersParams::getDescription (const NumLayersParams& params)
{
	ostringstream os;
	const string kindStr = (params.textureKind == GL_TEXTURE_3D
							? "3D Texture"
							: "2D Array Texture");
	os << kindStr + ", "
	   << params.numLayers << " layers, "
	   << "attached layer " << params.attachmentLayer << ".";
	return os.str();
}